

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__close_shape(stbtt_vertex *vertices,int num_vertices,int was_off,int start_off,
                      stbtt_int32 sx,stbtt_int32 sy,stbtt_int32 scx,stbtt_int32 scy,stbtt_int32 cx,
                      stbtt_int32 cy)

{
  stbtt_int32 sy_local;
  stbtt_int32 sx_local;
  int start_off_local;
  int was_off_local;
  int num_vertices_local;
  stbtt_vertex *vertices_local;
  
  if (start_off == 0) {
    if (was_off == 0) {
      stbtt_setvertex(vertices + num_vertices,'\x02',sx,sy,0,0);
    }
    else {
      stbtt_setvertex(vertices + num_vertices,'\x03',sx,sy,cx,cy);
    }
    start_off_local = num_vertices + 1;
  }
  else {
    start_off_local = num_vertices;
    if (was_off != 0) {
      start_off_local = num_vertices + 1;
      stbtt_setvertex(vertices + num_vertices,'\x03',cx + scx >> 1,cy + scy >> 1,cx,cy);
    }
    stbtt_setvertex(vertices + start_off_local,'\x03',sx,sy,scx,scy);
    start_off_local = start_off_local + 1;
  }
  return start_off_local;
}

Assistant:

static int stbtt__close_shape(stbtt_vertex *vertices, int num_vertices, int was_off, int start_off,
    stbtt_int32 sx, stbtt_int32 sy, stbtt_int32 scx, stbtt_int32 scy, stbtt_int32 cx, stbtt_int32 cy)
{
   if (start_off) {
      if (was_off)
         stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+scx)>>1, (cy+scy)>>1, cx,cy);
      stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, sx,sy,scx,scy);
   } else {
      if (was_off)
         stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve,sx,sy,cx,cy);
      else
         stbtt_setvertex(&vertices[num_vertices++], STBTT_vline,sx,sy,0,0);
   }
   return num_vertices;
}